

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DynamicSinglePixelOffsets::operator()
          (DynamicSinglePixelOffsets *this,IVec2 *pixCoord,IVec2 (*dst) [4])

{
  IVec2 *offset;
  Vector<int,_2> local_60;
  Vector<int,_2> local_58;
  tcu local_50 [8];
  IVec2 local_48;
  MultiplePixelOffsets local_40;
  
  local_58.m_data[0] = ((this->m_offsetRange).m_data[1] - (this->m_offsetRange).m_data[0]) + 1;
  local_60.m_data[1] = (int)*(undefined8 *)pixCoord->m_data;
  local_60.m_data[0] = (int)((ulong)*(undefined8 *)pixCoord->m_data >> 0x20);
  local_58.m_data[1] = local_58.m_data[0];
  tcu::mod<int,2>(local_50,&local_60,&local_58);
  offset = &local_48;
  tcu::operator+((this->m_offsetRange).m_data[0],(Vector<int,_2> *)local_50);
  SinglePixelOffsets::SinglePixelOffsets((SinglePixelOffsets *)&local_40,offset);
  MultiplePixelOffsets::operator()(&local_40,offset,dst);
  return;
}

Assistant:

void operator() (const IVec2& pixCoord, IVec2 (&dst)[4]) const
	{
		const int offsetRangeSize = m_offsetRange.y() - m_offsetRange.x() + 1;
		SinglePixelOffsets(tcu::mod(pixCoord.swizzle(1,0), IVec2(offsetRangeSize)) + m_offsetRange.x())(IVec2(), dst);
	}